

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall ncnn::ConvolutionDepthWise::create_pipeline(ConvolutionDepthWise *this,Option *opt)

{
  int *piVar1;
  void **ppvVar2;
  void *in_RSI;
  long in_RDI;
  Mat weight_data_int8_scales_g;
  Mat int8_weight_data_g;
  Mat weight_data_g;
  Option opt_q;
  int g;
  int weight_data_size_g;
  Mat int8_weight_data;
  Allocator *in_stack_fffffffffffffba8;
  size_t in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  void **ppvVar3;
  Mat *in_stack_fffffffffffffbc0;
  bool local_3d9;
  void *local_3d0;
  int *local_3c8;
  undefined8 local_3c0;
  undefined4 local_3b8;
  long *local_3b0;
  undefined4 local_3a8;
  undefined4 local_3a4;
  undefined4 local_3a0;
  undefined4 local_39c;
  undefined4 local_398;
  undefined8 local_390;
  void *local_388;
  int *local_380;
  long local_378;
  undefined4 local_370;
  long *local_368;
  undefined4 local_360;
  int local_35c;
  undefined4 uVar4;
  Option *in_stack_fffffffffffffca8;
  Mat *in_stack_fffffffffffffcb0;
  undefined1 local_2f8 [8];
  long *local_2f0;
  undefined1 local_2d1;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  void *local_2a0;
  int *local_298;
  long local_290;
  undefined4 local_288;
  long *local_280;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 local_270;
  undefined4 local_26c;
  int local_268;
  long local_260;
  void *local_258;
  int local_244;
  void **local_240;
  void **local_230;
  undefined1 *local_220;
  void **local_210;
  int local_200;
  undefined4 local_1fc;
  void **local_1f8;
  void **local_1f0;
  void **local_1e8;
  void **local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined4 local_1c4;
  void **local_1c0;
  undefined4 local_1b8;
  int local_1b4;
  long *local_1b0;
  void **local_1a8;
  int local_1a0;
  int local_19c;
  void **local_198;
  void **local_190;
  int local_188;
  int local_184;
  long *local_180;
  undefined1 *local_178;
  int local_170;
  undefined4 local_16c;
  void **local_168;
  int local_150;
  undefined4 local_14c;
  void **local_148;
  undefined1 *local_128;
  int local_110;
  undefined4 local_10c;
  void **local_108;
  int local_f0;
  undefined4 local_ec;
  void **local_e8;
  void *local_e0;
  void *local_d0;
  void *local_b0;
  void *local_a0;
  void **local_98;
  undefined8 local_90;
  undefined4 local_84;
  undefined8 local_80;
  Mat *local_78;
  int local_6c;
  undefined1 *local_68;
  undefined4 local_54;
  long local_50;
  void *local_48;
  int local_3c;
  void **local_38;
  long *local_30;
  undefined4 local_24;
  undefined8 local_20;
  void *local_18;
  undefined4 local_c;
  void **local_8;
  
  if ((((*(byte *)((long)in_RSI + 0x1e) & 1) != 0) && (*(long *)(in_RDI + 0x178) == 4)) &&
     (*(int *)(in_RDI + 0x10c) != 0)) {
    local_1c4 = *(undefined4 *)(in_RDI + 0x104);
    local_1c0 = &local_2a0;
    local_1d0 = 1;
    local_1d8 = 0;
    local_2a0 = (void *)0x0;
    local_298 = (int *)0x0;
    local_290 = 0;
    local_288 = 0;
    local_280 = (long *)0x0;
    local_278 = 0;
    local_274 = 0;
    local_270 = 0;
    local_26c = 0;
    local_268 = 0;
    local_260 = 0;
    local_258 = in_RSI;
    Mat::create(in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    local_1e0 = &local_2a0;
    if (local_2a0 != (void *)0x0) {
      local_98 = local_1e0;
    }
    local_3d9 = local_2a0 != (void *)0x0 && local_260 * local_268 != 0;
    if (local_3d9) {
      local_2b4 = *(int *)(in_RDI + 0x104) / *(int *)(in_RDI + 0x108);
      for (local_2b8 = 0; local_2b8 < *(int *)(in_RDI + 0x108); local_2b8 = local_2b8 + 1) {
        memcpy(local_2f8,local_258,0x40);
        local_2f0 = local_280;
        local_2d1 = 0;
        local_180 = (long *)(in_RDI + 0x168);
        local_184 = local_2b4 * local_2b8;
        local_178 = &stack0xfffffffffffffcc0;
        local_188 = local_2b4;
        local_78 = (Mat *)(*local_180 + (long)local_184 * *(long *)(in_RDI + 0x178));
        local_80 = *(undefined8 *)(in_RDI + 0x178);
        local_84 = *(undefined4 *)(in_RDI + 0x180);
        local_90 = *(undefined8 *)(in_RDI + 0x188);
        local_68 = &stack0xfffffffffffffcc0;
        local_6c = local_2b4;
        local_19c = local_2b4 * local_2b8;
        local_190 = &local_388;
        local_198 = &local_2a0;
        local_1a0 = local_2b4;
        local_48 = (void *)((long)local_2a0 + local_19c * local_290);
        local_50 = local_290;
        local_54 = local_288;
        local_38 = &local_388;
        local_3c = local_2b4;
        local_380 = (int *)0x0;
        local_378 = local_290;
        local_370 = local_288;
        local_368 = local_280;
        local_360 = 1;
        local_35c = local_2b4;
        uVar4 = 1;
        uVar4 = 1;
        uVar4 = 1;
        local_1b0 = (long *)(in_RDI + 0x1f8);
        local_1a8 = &local_3d0;
        local_1b4 = local_2b8;
        local_1b8 = 1;
        local_18 = (void *)(*local_1b0 + (long)local_2b8 * *(long *)(in_RDI + 0x208));
        local_20 = *(undefined8 *)(in_RDI + 0x208);
        local_24 = *(undefined4 *)(in_RDI + 0x210);
        local_30 = *(long **)(in_RDI + 0x218);
        local_8 = &local_3d0;
        local_c = 1;
        local_3c8 = (int *)0x0;
        local_3a8 = 1;
        local_3a4 = 1;
        local_3a0 = 1;
        local_39c = 1;
        local_398 = 1;
        local_390 = 1;
        local_3d0 = local_18;
        local_3c0 = local_20;
        local_3b8 = local_24;
        local_3b0 = local_30;
        local_388 = local_48;
        quantize_to_int8(local_78,(Mat *)(long)local_2b4,in_stack_fffffffffffffcb0,
                         in_stack_fffffffffffffca8);
        local_240 = &local_3d0;
        local_e8 = local_240;
        if (local_3c8 != (int *)0x0) {
          local_ec = 0xffffffff;
          LOCK();
          local_f0 = *local_3c8;
          *local_3c8 = *local_3c8 + -1;
          UNLOCK();
          if (local_f0 == 1) {
            if (local_3b0 == (long *)0x0) {
              local_e0 = local_3d0;
              if (local_3d0 != (void *)0x0) {
                free(local_3d0);
              }
            }
            else {
              (**(code **)(*local_3b0 + 0x18))(local_3b0,local_3d0);
            }
          }
        }
        local_3d0 = (void *)0x0;
        local_3c0 = 0;
        local_3b8 = 0;
        local_3a8 = 0;
        local_3a4 = 0;
        local_3a0 = 0;
        local_39c = 0;
        local_398 = 0;
        local_390 = 0;
        local_3c8 = (int *)0x0;
        local_230 = &local_388;
        local_108 = local_230;
        if (local_380 != (int *)0x0) {
          local_10c = 0xffffffff;
          LOCK();
          local_110 = *local_380;
          *local_380 = *local_380 + -1;
          UNLOCK();
          if (local_110 == 1) {
            if (local_368 == (long *)0x0) {
              local_d0 = local_388;
              if (local_388 != (void *)0x0) {
                free(local_388);
              }
            }
            else {
              (**(code **)(*local_368 + 0x18))(local_368,local_388);
            }
          }
        }
        local_388 = (void *)0x0;
        local_378 = 0;
        local_370 = 0;
        local_360 = 0;
        local_35c = 0;
        uVar4 = 0;
        uVar4 = 0;
        local_380 = (int *)0x0;
        local_220 = &stack0xfffffffffffffcc0;
        local_128 = local_220;
      }
      ppvVar2 = (void **)(in_RDI + 0x168);
      local_1f8 = &local_2a0;
      local_1f0 = ppvVar2;
      if (ppvVar2 != local_1f8) {
        if (local_298 != (int *)0x0) {
          local_1fc = 1;
          LOCK();
          local_200 = *local_298;
          *local_298 = *local_298 + 1;
          UNLOCK();
        }
        ppvVar3 = ppvVar2;
        local_168 = ppvVar2;
        if (*(long *)(in_RDI + 0x170) != 0) {
          piVar1 = *(int **)(in_RDI + 0x170);
          local_16c = 0xffffffff;
          LOCK();
          local_170 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_170 == 1) {
            if (*(long *)(in_RDI + 0x188) == 0) {
              local_a0 = *ppvVar2;
              if (local_a0 != (void *)0x0) {
                free(local_a0);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x188) + 0x18))(*(long **)(in_RDI + 0x188),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        ppvVar2[2] = (void *)0x0;
        *(undefined4 *)(ppvVar2 + 3) = 0;
        *(undefined4 *)(ppvVar2 + 5) = 0;
        *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
        *(undefined4 *)(ppvVar2 + 6) = 0;
        *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
        *(undefined4 *)(ppvVar2 + 7) = 0;
        ppvVar2[8] = (void *)0x0;
        ppvVar2[1] = (void *)0x0;
        *ppvVar3 = *local_1f8;
        ppvVar3[1] = local_1f8[1];
        ppvVar3[2] = local_1f8[2];
        *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_1f8 + 3);
        ppvVar3[4] = local_1f8[4];
        *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_1f8 + 5);
        *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_1f8 + 0x2c);
        *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_1f8 + 6);
        *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_1f8 + 0x34);
        *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_1f8 + 7);
        ppvVar3[8] = local_1f8[8];
        ppvVar2 = ppvVar3;
      }
      local_2b0 = 0;
      local_1e8 = ppvVar2;
    }
    else {
      local_244 = -100;
      local_2b0 = 1;
    }
    ppvVar2 = &local_2a0;
    if (local_298 != (int *)0x0) {
      local_14c = 0xffffffff;
      LOCK();
      local_150 = *local_298;
      *local_298 = *local_298 + -1;
      UNLOCK();
      if (local_150 == 1) {
        local_210 = ppvVar2;
        local_148 = ppvVar2;
        if (local_280 == (long *)0x0) {
          local_b0 = local_2a0;
          if (local_2a0 != (void *)0x0) {
            free(local_2a0);
          }
        }
        else {
          (**(code **)(*local_280 + 0x18))(local_280,local_2a0);
        }
      }
    }
    *ppvVar2 = (void *)0x0;
    ppvVar2[2] = (void *)0x0;
    *(undefined4 *)(ppvVar2 + 3) = 0;
    *(undefined4 *)(ppvVar2 + 5) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
    *(undefined4 *)(ppvVar2 + 6) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
    *(undefined4 *)(ppvVar2 + 7) = 0;
    ppvVar2[8] = (void *)0x0;
    ppvVar2[1] = (void *)0x0;
    if (local_2b0 != 0) {
      return local_244;
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise::create_pipeline(const Option& opt)
{
#if NCNN_INT8
    // runtime quantize the weight data
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_g = weight_data_size / group;

        for (int g = 0; g < group; g++)
        {
            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;
            opt_q.use_packing_layout = false;

            const Mat weight_data_g = weight_data.range(weight_data_size_g * g, weight_data_size_g);
            Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
            const Mat weight_data_int8_scales_g = weight_data_int8_scales.range(g, 1);
            quantize_to_int8(weight_data_g, int8_weight_data_g, weight_data_int8_scales_g, opt_q);
        }

        weight_data = int8_weight_data;
    }
#else
    (void)(opt);
#endif // NCNN_INT8

    return 0;
}